

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O2

void testBufferCompression(string *tempdir)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ostream *poVar4;
  size_type __new_size;
  char *pcVar5;
  undefined8 extraout_RAX;
  pointer in_RCX;
  uint extraout_EDX;
  uint line;
  uint line_00;
  uint extraout_EDX_00;
  ulong unaff_RBX;
  undefined1 auVar6 [12];
  char *pcStackY_70;
  size_t *psVar7;
  size_t outsz;
  vector<char,_std::allocator<char>_> buf;
  vector<char,_std::allocator<char>_> cbuf;
  
  uVar3 = exr_compress_max_buffer_size(0);
  auVar6 = exr_compress_max_buffer_size(0x80);
  if (uVar3 < 9) {
    pcStackY_70 = (char *)0x16;
LAB_0010b0a4:
    core_test_fail("bc0 < 9",pcStackY_70,auVar6._8_4_,in_RCX);
LAB_0010b0aa:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    iVar2 = (int)unaff_RBX;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
    poVar4 = std::operator<<(poVar4,") ");
    pcVar5 = (char *)exr_get_default_error_message(unaff_RBX & 0xffffffff);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar4);
    core_test_fail("exr_compress_buffer ( nullptr, 9, buf.data (), buf.size (), &cbuf[0], cbuf.size (), &outsz)"
                   ,(char *)0x20,line,in_RCX);
  }
  else {
    if (auVar6._0_8_ < 0x89) {
      pcStackY_70 = (char *)0x17;
      unaff_RBX = auVar6._0_8_;
      goto LAB_0010b0a4;
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"Max Buffer Size (0): ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)&std::cout,"Max Buffer Size (128): ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::endl<char,std::char_traits<char>>(poVar4);
    buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    cbuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    cbuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    cbuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    outsz._0_4_ = 0x6e65704f;
    outsz._4_2_ = 0x5845;
    outsz._6_1_ = 0x52;
    psVar7 = &outsz;
    std::vector<char,std::allocator<char>>::_M_assign_aux<char_const*>
              ((vector<char,std::allocator<char>> *)&buf,psVar7);
    __new_size = exr_compress_max_buffer_size
                           ((long)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                            (long)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start);
    std::vector<char,_std::allocator<char>_>::resize(&cbuf,__new_size);
    in_RCX = buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_finish +
             -(long)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start;
    uVar1 = exr_compress_buffer(0,9);
    unaff_RBX = (ulong)uVar1;
    if (uVar1 != 0) goto LAB_0010b0aa;
    poVar4 = std::operator<<((ostream *)&std::cout,"compressed size: ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::endl<char,std::char_traits<char>>(poVar4);
    in_RCX = buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start;
    iVar2 = exr_uncompress_buffer
                      (0,cbuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,
                       CONCAT17(outsz._7_1_,
                                CONCAT16(outsz._6_1_,CONCAT24(outsz._4_2_,(undefined4)outsz))),
                       buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       (long)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start,&outsz,psVar7);
    if (iVar2 == 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,"uncompressed size: ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::endl<char,std::char_traits<char>>(poVar4);
      uVar1 = extraout_EDX;
      if (*buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start == 'O') {
        std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                  (&cbuf.super__Vector_base<char,_std::allocator<char>_>);
        std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                  (&buf.super__Vector_base<char,_std::allocator<char>_>);
        return;
      }
      goto LAB_0010b15a;
    }
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
  poVar4 = std::operator<<(poVar4,") ");
  pcVar5 = (char *)exr_get_default_error_message(iVar2);
  poVar4 = std::operator<<(poVar4,pcVar5);
  std::endl<char,std::char_traits<char>>(poVar4);
  core_test_fail("exr_uncompress_buffer ( nullptr, cbuf.data (), outsz, &buf[0], buf.size (), &outsz)"
                 ,(char *)0x23,line_00,in_RCX);
  uVar1 = extraout_EDX_00;
LAB_0010b15a:
  core_test_fail("buf[0] != \'O\'",(char *)0x25,uVar1,in_RCX);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&cbuf.super__Vector_base<char,_std::allocator<char>_>);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&buf.super__Vector_base<char,_std::allocator<char>_>);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void
testBufferCompression (const std::string& tempdir)
{
    size_t bc0   = exr_compress_max_buffer_size (0);
    size_t bc128 = exr_compress_max_buffer_size (128);
    if (bc0 < 9) EXRCORE_TEST_FAIL (bc0 < 9);
    if (bc128 < 128 + 9) EXRCORE_TEST_FAIL (bc0 < 9);
    std::cout << "Max Buffer Size (0): " << bc0 << std::endl;
    std::cout << "Max Buffer Size (128): " << bc128 << std::endl;

    std::vector<char> buf, cbuf;
    buf = {'O', 'p', 'e', 'n', 'E', 'X', 'R'};
    cbuf.resize (exr_compress_max_buffer_size (buf.size ()));
    size_t outsz;
    EXRCORE_TEST_RVAL (exr_compress_buffer (
        nullptr, 9, buf.data (), buf.size (), &cbuf[0], cbuf.size (), &outsz));
    std::cout << "compressed size: " << outsz << std::endl;
    EXRCORE_TEST_RVAL (exr_uncompress_buffer (
        nullptr, cbuf.data (), outsz, &buf[0], buf.size (), &outsz));
    std::cout << "uncompressed size: " << outsz << std::endl;
    if (buf[0] != 'O') EXRCORE_TEST_FAIL (buf[0] != 'O');
}